

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O0

void * shemu_memcpy(void *Dest,void *Source,ND_SIZET Size)

{
  undefined8 local_30;
  ND_SIZET index;
  ND_SIZET Size_local;
  void *Source_local;
  void *Dest_local;
  
  if (Dest == (void *)0x0) {
    Dest_local = (void *)0x0;
  }
  else if (Source == (void *)0x0) {
    Dest_local = (void *)0x0;
  }
  else {
    for (local_30 = 0; Dest_local = Dest, local_30 < Size; local_30 = local_30 + 1) {
      *(undefined1 *)((long)Dest + local_30) = *(undefined1 *)((long)Source + local_30);
    }
  }
  return Dest_local;
}

Assistant:

void *
shemu_memcpy(
    void *Dest,
    const void *Source,
    ND_SIZET Size
    )
{
    if (ND_NULL == Dest)
    {
        return ND_NULL;
    }

    if (ND_NULL == Source)
    {
        return ND_NULL;
    }

    for (ND_SIZET index = 0; index < Size; index++)
    {
        ((char *)Dest)[index] = ((const char *)Source)[index];
    }

    return Dest;
}